

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O3

void poly2_reverse_700(poly2 *out,poly2 *in)

{
  undefined1 auVar1 [16];
  size_t i_1;
  long lVar2;
  byte bVar3;
  crypto_word_t *pcVar4;
  size_t i;
  long lVar5;
  ulong *puVar6;
  crypto_word_t cVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong local_68 [2];
  poly2 t;
  
  lVar5 = 0;
  do {
    cVar7 = in->v[lVar5];
    puVar6 = &word_reverse(unsigned_long)::kMasks;
    lVar2 = 0;
    do {
      bVar3 = (byte)(1 << ((byte)lVar2 & 0x1f));
      cVar7 = (*puVar6 & cVar7) << (bVar3 & 0x3f) | cVar7 >> (bVar3 & 0x3f) & *puVar6;
      lVar2 = lVar2 + 1;
      puVar6 = puVar6 + 1;
    } while (lVar2 != 6);
    local_68[lVar5] = cVar7;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xb);
  lVar5 = 8;
  pcVar4 = out->v;
  do {
    auVar1 = *(undefined1 (*) [16])(local_68 + lVar5);
    auVar8 = *(undefined1 (*) [16])(t.v + lVar5 + -1);
    auVar9._0_8_ = auVar8._8_8_;
    auVar9._8_4_ = auVar8._0_4_;
    auVar9._12_4_ = auVar8._4_4_;
    auVar8._0_8_ = auVar1._8_8_;
    auVar8._8_4_ = auVar1._0_4_;
    auVar8._12_4_ = auVar1._4_4_;
    *pcVar4 = auVar8._0_8_ << 0x3c | auVar9._0_8_ >> 4;
    pcVar4[1] = auVar8._8_8_ << 0x3c | auVar9._8_8_ >> 4;
    lVar5 = lVar5 + -2;
    pcVar4 = pcVar4 + 2;
  } while (lVar5 != -2);
  out->v[10] = local_68[0] >> 4;
  return;
}

Assistant:

static void poly2_reverse_700(struct poly2 *out, const struct poly2 *in) {
  struct poly2 t;
  for (size_t i = 0; i < WORDS_PER_POLY; i++) {
    t.v[i] = word_reverse(in->v[i]);
  }

  static const size_t shift = BITS_PER_WORD - ((N - 1) % BITS_PER_WORD);
  for (size_t i = 0; i < WORDS_PER_POLY - 1; i++) {
    out->v[i] = t.v[WORDS_PER_POLY - 1 - i] >> shift;
    out->v[i] |= t.v[WORDS_PER_POLY - 2 - i] << (BITS_PER_WORD - shift);
  }
  out->v[WORDS_PER_POLY - 1] = t.v[0] >> shift;
}